

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::print_attr_metas_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,AttrMeta *meta,uint32_t indent)

{
  string *psVar1;
  ostream *poVar2;
  value_type *pvVar3;
  value_type_conflict5 *pvVar4;
  tinyusdz *ptVar5;
  value_type *pvVar6;
  value_type *pvVar7;
  value_type_conflict *pvVar8;
  value_type *this_00;
  value_type_conflict3 *pvVar9;
  uint32_t indent_00;
  bool v;
  Interpolation interp;
  uint32_t v_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  token *v_01;
  undefined8 extraout_RDX_02;
  token *v_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  token *v_03;
  undefined8 extraout_RDX_06;
  token *v_04;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  StringData *v_05;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 uVar10;
  StringData *v_06;
  undefined8 extraout_RDX_13;
  pprint *this_01;
  char *this_02;
  StringData *item;
  _Rb_tree_node_base *p_Var11;
  undefined1 auVar12 [16];
  stringstream ss;
  allocator local_249;
  string local_248;
  string local_228;
  string local_208;
  string *local_1e8;
  tinyusdz *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  this_01 = (pprint *)((ulong)meta & 0xffffffff);
  local_1e8 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  uVar10 = extraout_RDX;
  if (*this == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_(&local_248,this_01,(uint32_t)extraout_RDX);
    poVar2 = ::std::operator<<(local_1a8,(string *)&local_248);
    poVar2 = ::std::operator<<(poVar2,"interpolation = ");
    pvVar3 = nonstd::optional_lite::optional<tinyusdz::Interpolation>::value
                       ((optional<tinyusdz::Interpolation> *)this);
    to_string_abi_cxx11_(&local_208,(tinyusdz *)(ulong)*pvVar3,interp);
    ::std::__cxx11::string::string((string *)&local_1d8,"\"",&local_249);
    quote(&local_228,&local_208,&local_1d8);
    poVar2 = ::std::operator<<(poVar2,(string *)&local_228);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    uVar10 = extraout_RDX_00;
  }
  if (this[8] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_(&local_248,this_01,(uint32_t)uVar10);
    poVar2 = ::std::operator<<(local_1a8,(string *)&local_248);
    poVar2 = ::std::operator<<(poVar2,"elementSize = ");
    pvVar4 = nonstd::optional_lite::optional<unsigned_int>::value
                       ((optional<unsigned_int> *)(this + 8));
    to_string_abi_cxx11_(&local_228,(tinyusdz *)(ulong)*pvVar4,v_00);
    poVar2 = ::std::operator<<(poVar2,(string *)&local_228);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    uVar10 = extraout_RDX_01;
  }
  if (this[0x198] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_(&local_248,this_01,(uint32_t)uVar10);
    poVar2 = ::std::operator<<(local_1a8,(string *)&local_248);
    poVar2 = ::std::operator<<(poVar2,"bindMaterialAs = ");
    ptVar5 = (tinyusdz *)
             nonstd::optional_lite::optional<tinyusdz::Token>::value
                       ((optional<tinyusdz::Token> *)(this + 0x198));
    to_string_abi_cxx11_(&local_208,ptVar5,v_01);
    ::std::__cxx11::string::string((string *)&local_1d8,"\"",&local_249);
    quote(&local_228,&local_208,&local_1d8);
    poVar2 = ::std::operator<<(poVar2,(string *)&local_228);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    uVar10 = extraout_RDX_02;
  }
  if (this[0x98] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_(&local_248,this_01,(uint32_t)uVar10);
    poVar2 = ::std::operator<<(local_1a8,(string *)&local_248);
    poVar2 = ::std::operator<<(poVar2,"connectability = ");
    ptVar5 = (tinyusdz *)
             nonstd::optional_lite::optional<tinyusdz::Token>::value
                       ((optional<tinyusdz::Token> *)(this + 0x98));
    to_string_abi_cxx11_(&local_208,ptVar5,v_02);
    ::std::__cxx11::string::string((string *)&local_1d8,"\"",&local_249);
    quote(&local_228,&local_208,&local_1d8);
    poVar2 = ::std::operator<<(poVar2,(string *)&local_228);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    uVar10 = extraout_RDX_03;
  }
  if (this[0x148] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_(&local_248,this_01,(uint32_t)uVar10);
    poVar2 = ::std::operator<<(local_1a8,(string *)&local_248);
    poVar2 = ::std::operator<<(poVar2,"displayName = ");
    pvVar6 = nonstd::optional_lite::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(this + 0x148));
    ::std::__cxx11::string::string((string *)&local_208,"\"",(allocator *)&local_1d8);
    quote(&local_228,pvVar6,&local_208);
    poVar2 = ::std::operator<<(poVar2,(string *)&local_228);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    uVar10 = extraout_RDX_04;
  }
  if (this[0x170] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_(&local_248,this_01,(uint32_t)uVar10);
    poVar2 = ::std::operator<<(local_1a8,(string *)&local_248);
    poVar2 = ::std::operator<<(poVar2,"displayGroup = ");
    pvVar6 = nonstd::optional_lite::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(this + 0x170));
    ::std::__cxx11::string::string((string *)&local_208,"\"",(allocator *)&local_1d8);
    quote(&local_228,pvVar6,&local_208);
    poVar2 = ::std::operator<<(poVar2,(string *)&local_228);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    uVar10 = extraout_RDX_05;
  }
  if (this[0xc0] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_(&local_248,this_01,(uint32_t)uVar10);
    poVar2 = ::std::operator<<(local_1a8,(string *)&local_248);
    poVar2 = ::std::operator<<(poVar2,"outputName = ");
    ptVar5 = (tinyusdz *)
             nonstd::optional_lite::optional<tinyusdz::Token>::value
                       ((optional<tinyusdz::Token> *)(this + 0xc0));
    to_string_abi_cxx11_(&local_208,ptVar5,v_03);
    ::std::__cxx11::string::string((string *)&local_1d8,"\"",&local_249);
    quote(&local_228,&local_208,&local_1d8);
    poVar2 = ::std::operator<<(poVar2,(string *)&local_228);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    uVar10 = extraout_RDX_06;
  }
  if (this[0xe8] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_(&local_248,this_01,(uint32_t)uVar10);
    poVar2 = ::std::operator<<(local_1a8,(string *)&local_248);
    poVar2 = ::std::operator<<(poVar2,"renderType = ");
    ptVar5 = (tinyusdz *)
             nonstd::optional_lite::optional<tinyusdz::Token>::value
                       ((optional<tinyusdz::Token> *)(this + 0xe8));
    to_string_abi_cxx11_(&local_208,ptVar5,v_04);
    ::std::__cxx11::string::string((string *)&local_1d8,"\"",&local_249);
    quote(&local_228,&local_208,&local_1d8);
    poVar2 = ::std::operator<<(poVar2,(string *)&local_228);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    uVar10 = extraout_RDX_07;
  }
  indent_00 = (uint32_t)meta;
  if (this[0x110] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_(&local_248,this_01,(uint32_t)uVar10);
    poVar2 = ::std::operator<<(local_1a8,(string *)&local_248);
    pvVar7 = nonstd::optional_lite::
             optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
             ::value((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                      *)(this + 0x110));
    ::std::__cxx11::string::string((string *)&local_208,"sdrMetadata",(allocator *)&local_1d8);
    print_customData(&local_228,pvVar7,&local_208,indent_00);
    ::std::operator<<(poVar2,(string *)&local_228);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    uVar10 = extraout_RDX_08;
  }
  if (this[0x10] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_(&local_248,this_01,(uint32_t)uVar10);
    poVar2 = ::std::operator<<(local_1a8,(string *)&local_248);
    poVar2 = ::std::operator<<(poVar2,"hidden = ");
    pvVar8 = nonstd::optional_lite::optional<bool>::value((optional<bool> *)(this + 0x10));
    to_string_abi_cxx11_(&local_228,(tinyusdz *)(ulong)*pvVar8,v);
    poVar2 = ::std::operator<<(poVar2,(string *)&local_228);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    uVar10 = extraout_RDX_09;
  }
  if (this[0x18] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_(&local_248,this_01,(uint32_t)uVar10);
    poVar2 = ::std::operator<<(local_1a8,(string *)&local_248);
    poVar2 = ::std::operator<<(poVar2,"comment = ");
    this_00 = nonstd::optional_lite::optional<tinyusdz::value::StringData>::value
                        ((optional<tinyusdz::value::StringData> *)(this + 0x18));
    to_string_abi_cxx11_(&local_228,(tinyusdz *)this_00,v_05);
    poVar2 = ::std::operator<<(poVar2,(string *)&local_228);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    uVar10 = extraout_RDX_10;
  }
  if (this[0x88] == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_(&local_248,this_01,(uint32_t)uVar10);
    poVar2 = ::std::operator<<(local_1a8,(string *)&local_248);
    this_02 = "weight = ";
    poVar2 = ::std::operator<<(poVar2,"weight = ");
    pvVar9 = nonstd::optional_lite::optional<double>::value((optional<double> *)(this + 0x88));
    (anonymous_namespace)::dtos_abi_cxx11_(&local_228,(_anonymous_namespace_ *)this_02,*pvVar9);
    poVar2 = ::std::operator<<(poVar2,(string *)&local_228);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    uVar10 = extraout_RDX_11;
  }
  if (this[0x50] == (tinyusdz)0x1) {
    pvVar7 = nonstd::optional_lite::
             optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
             ::value((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                      *)(this + 0x50));
    ::std::__cxx11::string::string((string *)&local_228,"customData",(allocator *)&local_208);
    print_customData(&local_248,pvVar7,&local_228,indent_00);
    ::std::operator<<(local_1a8,(string *)&local_248);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    uVar10 = extraout_RDX_12;
  }
  auVar12._8_8_ = uVar10;
  auVar12._0_8_ = *(undefined8 *)(this + 0x1d8);
  while (uVar10 = auVar12._8_8_, p_Var11 = auVar12._0_8_,
        p_Var11 != (_Rb_tree_node_base *)(this + 0x1c8)) {
    print_meta(&local_248,(MetaVariable *)(p_Var11 + 2),indent_00,false,(string *)(p_Var11 + 1));
    ::std::operator<<(local_1a8,(string *)&local_248);
    ::std::__cxx11::string::_M_dispose();
    auVar12 = ::std::_Rb_tree_increment(p_Var11);
  }
  local_1e0 = *(tinyusdz **)(this + 0x1f8);
  for (ptVar5 = *(tinyusdz **)(this + 0x1f0); psVar1 = local_1e8, ptVar5 != local_1e0;
      ptVar5 = ptVar5 + 0x30) {
    pprint::Indent_abi_cxx11_(&local_248,this_01,(uint32_t)uVar10);
    poVar2 = ::std::operator<<(local_1a8,(string *)&local_248);
    to_string_abi_cxx11_(&local_228,ptVar5,v_06);
    poVar2 = ::std::operator<<(poVar2,(string *)&local_228);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    uVar10 = extraout_RDX_13;
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return psVar1;
}

Assistant:

std::string print_attr_metas(const AttrMeta &meta, const uint32_t indent) {
  std::stringstream ss;

  if (meta.interpolation) {
    ss << pprint::Indent(indent)
       << "interpolation = " << quote(to_string(meta.interpolation.value()))
       << "\n";
  }

  if (meta.elementSize) {
    ss << pprint::Indent(indent)
       << "elementSize = " << to_string(meta.elementSize.value()) << "\n";
  }

  if (meta.bindMaterialAs) {
    ss << pprint::Indent(indent)
       << "bindMaterialAs = " << quote(to_string(meta.bindMaterialAs.value()))
       << "\n";
  }

  if (meta.connectability) {
    ss << pprint::Indent(indent)
       << "connectability = " << quote(to_string(meta.connectability.value()))
       << "\n";
  }

  if (meta.displayName) {
    ss << pprint::Indent(indent)
       << "displayName = " << quote(meta.displayName.value()) << "\n";
  }

  if (meta.displayGroup) {
    ss << pprint::Indent(indent)
       << "displayGroup = " << quote(meta.displayGroup.value()) << "\n";
  }

  if (meta.outputName) {
    ss << pprint::Indent(indent)
       << "outputName = " << quote(to_string(meta.outputName.value())) << "\n";
  }

  if (meta.renderType) {
    ss << pprint::Indent(indent)
       << "renderType = " << quote(to_string(meta.renderType.value())) << "\n";
  }

  if (meta.sdrMetadata) {
    ss << pprint::Indent(indent)
       << print_customData(meta.sdrMetadata.value(), "sdrMetadata", indent);
  }

  if (meta.hidden) {
    ss << pprint::Indent(indent)
       << "hidden = " << to_string(meta.hidden.value()) << "\n";
  }

  if (meta.comment) {
    ss << pprint::Indent(indent)
       << "comment = " << to_string(meta.comment.value()) << "\n";
  }

  if (meta.weight) {
    ss << pprint::Indent(indent) << "weight = " << dtos(meta.weight.value())
       << "\n";
  }

  if (meta.customData) {
    ss << print_customData(meta.customData.value(), "customData", indent);
  }

  // other user defined metadataum.
  for (const auto &item : meta.meta) {
    // attribute meta does not emit type_name
    ss << print_meta(item.second, indent, /* emit_type_name */false, item.first);
  }

  for (const auto &item : meta.stringData) {
    ss << pprint::Indent(indent) << to_string(item) << "\n";
  }

  return ss.str();
}